

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseEncodedData(CFIReaderImpl *this,size_t index,size_t len)

{
  undefined8 *puVar1;
  iterator iVar2;
  DeadlyImportError *pDVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<const_Assimp::FIValue> sVar5;
  string uri;
  string local_48;
  
  if (len < 0x20) {
    puVar1 = *(undefined8 **)(defaultDecoder + len * 8);
    if (puVar1 == (undefined8 *)0x0) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_48,len);
      std::operator+(&uri,"Invalid encoding algorithm index ",&local_48);
      DeadlyImportError::DeadlyImportError(pDVar3,&uri);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    (**(code **)*puVar1)(this,puVar1,*(undefined8 *)(index + 0x10));
    _Var4._M_pi = extraout_RDX;
  }
  else {
    if ((ulong)(*(long *)(index + 0x48) - *(long *)(index + 0x40) >> 5) <= len - 0x20) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>(&local_48,len);
      std::operator+(&uri,"Invalid encoding algorithm index ",&local_48);
      DeadlyImportError::DeadlyImportError(pDVar3,&uri);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string
              ((string *)&uri,(string *)(*(long *)(index + 0x40) + (len - 0x20) * 0x20));
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Assimp::FIDecoder,_std::default_delete<Assimp::FIDecoder>_>_>_>_>
                    *)(index + 0x1d0),&uri);
    if (iVar2._M_node == (_Base_ptr)(index + 0x1d8)) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::operator+(&local_48,"Unsupported encoding algorithm ",&uri);
      DeadlyImportError::DeadlyImportError(pDVar3,&local_48);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    (**(code **)**(undefined8 **)(iVar2._M_node + 2))
              (this,*(undefined8 **)(iVar2._M_node + 2),*(undefined8 *)(index + 0x10));
    std::__cxx11::string::~string((string *)&uri);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar5.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const FIValue> parseEncodedData(size_t index, size_t len) {
        if (index < 32) {
            FIDecoder *decoder = defaultDecoder[index];
            if (!decoder) {
                throw DeadlyImportError("Invalid encoding algorithm index " + to_string(index));
            }
            return decoder->decode(dataP, len);
        }
        else {
            if (index - 32 >= vocabulary.encodingAlgorithmTable.size()) {
                throw DeadlyImportError("Invalid encoding algorithm index " + to_string(index));
            }
            std::string uri = vocabulary.encodingAlgorithmTable[index - 32];
            auto it = decoderMap.find(uri);
            if (it == decoderMap.end()) {
                throw DeadlyImportError("Unsupported encoding algorithm " + uri);
            }
            else {
                return it->second->decode(dataP, len);
            }
        }
    }